

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOService.cpp
# Opt level: O0

void anon_unknown.dwarf_46d210::init_curious_service(Caliper *c,Channel *channel)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Events *pEVar2;
  ostream *poVar3;
  socklen_t __len;
  sockaddr *__addr;
  sockaddr *__addr_00;
  string local_3c0;
  Log local_3a0;
  function<void_(cali::Caliper_*,_cali::Channel_*)> local_198;
  function<void_(cali::Caliper_*,_cali::Channel_*)> local_178;
  allocator<char> local_151;
  string local_150 [32];
  undefined8 local_130;
  allocator<char> local_121;
  string local_120 [32];
  undefined8 local_100;
  allocator<char> local_f1;
  string local_f0 [32];
  undefined8 local_d0;
  allocator<char> local_c1;
  string local_c0 [32];
  undefined8 local_a0;
  allocator<char> local_91;
  string local_90 [32];
  undefined8 local_70;
  undefined1 local_68 [8];
  Variant v_true;
  allocator<char> local_41;
  string local_40 [32];
  undefined8 local_20;
  Attribute subscribe_attr;
  Channel *channel_local;
  Caliper *c_local;
  
  subscribe_attr.m_node = (Node *)channel;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"subscription_event",&local_41);
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[2])
                    (c,local_40);
  local_20 = CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  cali::Variant::Variant((Variant *)local_68,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"io.region",&local_91);
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_90,4,0x14,1,&local_20,local_68);
  (anonymous_namespace)::io_region_attr = CONCAT44(extraout_var_00,iVar1);
  local_70 = (anonymous_namespace)::io_region_attr;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"io.filesystem",&local_c1);
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_c0,4,0x54,0,0,0);
  (anonymous_namespace)::io_filesystem_attr = CONCAT44(extraout_var_01,iVar1);
  local_a0 = (anonymous_namespace)::io_filesystem_attr;
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"io.mount.point",&local_f1);
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_f0,4,0x54,0,0,0);
  (anonymous_namespace)::io_mount_point_attr = CONCAT44(extraout_var_02,iVar1);
  local_d0 = (anonymous_namespace)::io_mount_point_attr;
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"io.bytes.read",&local_121);
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_120,3,0x815,0,0,0);
  (anonymous_namespace)::io_bytes_read_attr = CONCAT44(extraout_var_03,iVar1);
  local_100 = (anonymous_namespace)::io_bytes_read_attr;
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"io.bytes.written",&local_151);
  __len = 0x815;
  iVar1 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_150,3,0x815,0,0,0);
  (anonymous_namespace)::io_bytes_written_attr = CONCAT44(extraout_var_04,iVar1);
  local_130 = (anonymous_namespace)::io_bytes_written_attr;
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  pEVar2 = cali::Channel::events((Channel *)subscribe_attr.m_node);
  std::function<void(cali::Caliper*,cali::Channel*)>::
  function<void(&)(cali::Caliper*,cali::Channel*),void>
            ((function<void(cali::Caliper*,cali::Channel*)> *)&local_178,init_curious_in_channel);
  cali::util::callback<void_(cali::Caliper_*,_cali::Channel_*)>::connect
            (&pEVar2->post_init_evt,(int)&local_178,__addr,__len);
  std::function<void_(cali::Caliper_*,_cali::Channel_*)>::~function(&local_178);
  pEVar2 = cali::Channel::events((Channel *)subscribe_attr.m_node);
  std::function<void(cali::Caliper*,cali::Channel*)>::
  function<void(&)(cali::Caliper*,cali::Channel*),void>
            ((function<void(cali::Caliper*,cali::Channel*)> *)&local_198,finalize_curious_in_channel
            );
  cali::util::callback<void_(cali::Caliper_*,_cali::Channel_*)>::connect
            (&pEVar2->pre_finish_evt,(int)&local_198,__addr_00,__len);
  std::function<void_(cali::Caliper_*,_cali::Channel_*)>::~function(&local_198);
  cali::Log::Log(&local_3a0,1);
  poVar3 = cali::Log::stream(&local_3a0);
  cali::Channel::name_abi_cxx11_(&local_3c0,(Channel *)subscribe_attr.m_node);
  poVar3 = std::operator<<(poVar3,(string *)&local_3c0);
  poVar3 = std::operator<<(poVar3,": Registered io service");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_3c0);
  cali::Log::~Log(&local_3a0);
  return;
}

Assistant:

void init_curious_service(Caliper* c, Channel* channel)
{
    Attribute subscribe_attr = c->get_attribute("subscription_event");
    Variant   v_true(true);

    // create I/O attributes
    io_region_attr =
        c->create_attribute("io.region", CALI_TYPE_STRING, CALI_ATTR_SCOPE_THREAD, 1, &subscribe_attr, &v_true);
    io_filesystem_attr =
        c->create_attribute("io.filesystem", CALI_TYPE_STRING, CALI_ATTR_SCOPE_THREAD | CALI_ATTR_SKIP_EVENTS);
    io_mount_point_attr =
        c->create_attribute("io.mount.point", CALI_TYPE_STRING, CALI_ATTR_SCOPE_THREAD | CALI_ATTR_SKIP_EVENTS);

    io_bytes_read_attr = c->create_attribute(
        "io.bytes.read",
        CALI_TYPE_UINT,
        CALI_ATTR_SCOPE_THREAD | CALI_ATTR_ASVALUE | CALI_ATTR_AGGREGATABLE
    );
    io_bytes_written_attr = c->create_attribute(
        "io.bytes.written",
        CALI_TYPE_UINT,
        CALI_ATTR_SCOPE_THREAD | CALI_ATTR_ASVALUE | CALI_ATTR_AGGREGATABLE
    );

    // register Caliper post_init_evt and finish_evt callbacks
    channel->events().post_init_evt.connect(init_curious_in_channel);

    // finish_evt: unregister channel from curious (??)
    channel->events().pre_finish_evt.connect(finalize_curious_in_channel);

    Log(1).stream() << channel->name() << ": Registered io service" << std::endl;
}